

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::normalizePosition(AbstractScrollAreaPrivate *this)

{
  int iVar1;
  QSize QVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if ((this->topLeftCorner).xp < 0) {
    (this->topLeftCorner).xp = 0;
  }
  if ((this->topLeftCorner).yp < 0) {
    (this->topLeftCorner).yp = 0;
  }
  QVar2 = QWidget::size(this->viewport);
  iVar3 = (this->scrolledAreaSize).wd;
  iVar1 = (this->scrolledAreaSize).ht;
  iVar5 = iVar3 - QVar2.wd;
  iVar4 = 0;
  if ((iVar5 == 0 || iVar3 < QVar2.wd) || (iVar4 = iVar5, iVar5 < (this->topLeftCorner).xp)) {
    (this->topLeftCorner).xp = iVar4;
  }
  iVar3 = 0;
  if ((iVar1 <= QVar2.ht) || (iVar3 = iVar1 - QVar2.ht, iVar3 < (this->topLeftCorner).yp)) {
    (this->topLeftCorner).yp = iVar3;
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::normalizePosition()
{
	if( topLeftCorner.x() < 0 )
		topLeftCorner.setX( 0 );

	if( topLeftCorner.y() < 0 )
		topLeftCorner.setY( 0 );

	const QSize s = viewport->size();

	const QPoint maxPos = QPoint( scrolledAreaSize.width() - s.width(),
		scrolledAreaSize.height() - s.height() );

	if( scrolledAreaSize.width() > s.width() )
	{
		if( maxPos.x() < topLeftCorner.x() )
			topLeftCorner.setX( maxPos.x() );
	}
	else
		topLeftCorner.setX( 0 );

	if( scrolledAreaSize.height() > s.height() )
	{
		if( maxPos.y() < topLeftCorner.y() )
			topLeftCorner.setY( maxPos.y() );
	}
	else
		topLeftCorner.setY( 0 );
}